

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O3

Status __thiscall leveldb::DBImpl::DumpRange(DBImpl *this,string *fname,Slice *start,Slice *end)

{
  Comparator *pCVar1;
  char cVar2;
  int iVar3;
  TableBuilder *this_00;
  long *plVar4;
  uint64_t uVar5;
  DBImpl *pDVar6;
  char *__tmp;
  _func_int **pp_Var7;
  _func_int **pp_Var8;
  Slice SVar9;
  WritableFile *file;
  Options options;
  Slice local_f0;
  WritableFile *local_e0;
  DBImpl *local_d8;
  string *local_d0;
  Slice *local_c8;
  void *local_c0;
  Slice local_b8;
  void *local_a8;
  undefined2 local_a0;
  undefined8 local_98;
  Options local_90;
  
  (this->super_DB)._vptr_DB = (_func_int **)0x0;
  local_d8 = this;
  (**(code **)(*(long *)fname->_M_string_length + 0x20))
            (&local_a8,(long *)fname->_M_string_length,start,&local_e0);
  if (local_a8 != (void *)0x0) {
    operator_delete__(local_a8);
  }
  Options::Options(&local_90);
  local_90.filter_policy = (FilterPolicy *)0x0;
  local_90.compression = kSnappyCompression;
  this_00 = (TableBuilder *)operator_new(8);
  local_c8 = start;
  TableBuilder::TableBuilder(this_00,&local_90,local_e0);
  local_a0 = 0x100;
  local_98 = 0;
  local_d0 = fname;
  plVar4 = (long *)(**(code **)((fname->_M_dataplus)._M_p + 0x30))(fname);
  (**(code **)(*plVar4 + 0x28))(plVar4,end);
  while( true ) {
    cVar2 = (**(code **)(*plVar4 + 0x10))(plVar4);
    pCVar1 = local_90.comparator;
    if (cVar2 == '\0') break;
    SVar9 = (Slice)(**(code **)(*plVar4 + 0x40))(plVar4);
    local_f0 = SVar9;
    iVar3 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_f0);
    if (-1 < iVar3) break;
    SVar9 = (Slice)(**(code **)(*plVar4 + 0x40))(plVar4);
    local_f0 = SVar9;
    SVar9 = (Slice)(**(code **)(*plVar4 + 0x48))(plVar4);
    local_b8 = SVar9;
    TableBuilder::Add(this_00,&local_f0,&local_b8);
    (**(code **)(*plVar4 + 0x30))(plVar4);
  }
  TableBuilder::Finish((TableBuilder *)&local_f0);
  pDVar6 = local_d8;
  pp_Var7 = (_func_int **)local_f0.data_;
  (local_d8->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
  if ((_func_int **)local_f0.data_ == (_func_int **)0x0) {
    uVar5 = TableBuilder::FileSize(this_00);
    if (uVar5 == 0) {
      __assert_fail("builder->FileSize() > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                    ,0x5c9,
                    "virtual Status leveldb::DBImpl::DumpRange(const std::string &, const Slice &, const Slice &)"
                   );
    }
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
    (*local_e0->_vptr_WritableFile[5])(&local_f0);
    pDVar6 = local_d8;
    (local_d8->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
    pp_Var7 = (_func_int **)local_f0.data_;
    if ((_func_int **)local_f0.data_ == (_func_int **)0x0) {
      (*local_e0->_vptr_WritableFile[3])(&local_f0);
      (pDVar6->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
      pp_Var7 = (_func_int **)local_f0.data_;
    }
  }
  else {
    TableBuilder::~TableBuilder(this_00);
    operator_delete(this_00);
  }
  if (local_e0 != (WritableFile *)0x0) {
    (*local_e0->_vptr_WritableFile[1])();
  }
  local_e0 = (WritableFile *)0x0;
  (**(code **)(*plVar4 + 0x50))(&local_f0,plVar4);
  pp_Var8 = pp_Var7;
  SVar9 = local_f0;
  if (local_f0.data_ != (char *)0x0) {
    operator_delete__(local_f0.data_);
    (**(code **)(*plVar4 + 0x50))(&local_f0,plVar4);
    SVar9.size_ = local_f0.size_;
    SVar9.data_ = (char *)pp_Var7;
    (pDVar6->super_DB)._vptr_DB = (_func_int **)local_f0.data_;
    pp_Var8 = (_func_int **)local_f0.data_;
    if (pp_Var7 != (_func_int **)0x0) {
      local_f0.data_ = (char *)pp_Var7;
      operator_delete__(pp_Var7);
      SVar9.size_ = local_f0.size_;
      SVar9.data_ = local_f0.data_;
      pp_Var8 = (pDVar6->super_DB)._vptr_DB;
    }
  }
  local_f0 = SVar9;
  (**(code **)(*plVar4 + 8))(plVar4);
  if (pp_Var8 != (_func_int **)0x0) {
    (**(code **)(*(long *)local_d0->_M_string_length + 0x40))
              (&local_c0,(long *)local_d0->_M_string_length,local_c8);
    pDVar6 = local_d8;
    if (local_c0 != (void *)0x0) {
      operator_delete__(local_c0);
    }
  }
  return (Status)(char *)pDVar6;
}

Assistant:

Status DBImpl::DumpRange(const std::string& fname,
                         const Slice& start, 
                         const Slice& end) {
    Status s;
    WritableFile* file;
    env_->NewWritableFile(fname, &file);

    Options options;
    options.filter_policy = nullptr;
    options.compression = kSnappyCompression;
    TableBuilder* builder = new TableBuilder(options, file);

    ReadOptions readoption;
    readoption.fill_cache = true;
    Iterator *it = NewIterator(readoption);
    //printf("START DUMPING....\n");
    
    for (it->Seek(start); 
         it->Valid() && options.comparator->Compare(it->key(), end) < 0;
         it->Next()) {
       //printf("\rDUMP FOR KEY: %s\n", it->key().ToString().c_str());
       builder->Add(it->key(), it->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      assert(builder->FileSize() > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    // Check for input iterator errors
    if (!it->status().ok()) {
      s = it->status();
    }
    delete it;

    if (s.ok()) {
      // Keep it
    } else {
      env_->DeleteFile(fname);
    }
    return s;
}